

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O0

void __thiscall
nuraft::raft_server::auto_fwd_release_rpc_cli
          (raft_server *this,ptr<auto_fwd_pkg> *cur_pkg,ptr<rpc_client> *rpc_cli)

{
  bool bVar1;
  element_type *peVar2;
  _Placeholder<2> *__args_5;
  element_type *peVar3;
  size_type sVar4;
  element_type *peVar5;
  offset_in_raft_server_to_subr *in_RSI;
  long in_RDI;
  rpc_handler handler;
  auto_fwd_req_resp entry;
  unique_lock<std::mutex> ll;
  unique_lock<std::mutex> l;
  anon_class_32_4_602b9eac put_back_to_idle_list;
  bool is_blocking_mode;
  size_t max_conns;
  ptr<raft_params> params;
  auto_fwd_req_resp *in_stack_fffffffffffffe58;
  auto_fwd_req_resp *in_stack_fffffffffffffe60;
  _Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *in_stack_fffffffffffffe68;
  EventAwaiter *in_stack_fffffffffffffe70;
  context *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  _Placeholder<1> *__args_4;
  anon_class_32_4_602b9eac *in_stack_fffffffffffffeb0;
  undefined1 local_f0 [32];
  string local_d0 [32];
  _List_node_base *local_b0;
  undefined1 local_a8 [80];
  long local_58;
  byte local_45;
  int local_34;
  long local_30;
  _Placeholder<1> local_28 [40];
  
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1fbd62);
  __args_4 = local_28;
  nuraft::context::get_params(in_stack_fffffffffffffe78);
  local_34 = 1;
  peVar2 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1fbd8c);
  __args_5 = (_Placeholder<2> *)std::max<int>(&local_34,&peVar2->auto_forwarding_max_connections_);
  local_30 = (long)*(int *)__args_5;
  peVar2 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1fbdc4);
  local_45 = peVar2->return_method_ == blocking;
  local_58 = local_30;
  std::
  __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1fbe10);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_stack_fffffffffffffe60,
             (mutex_type *)in_stack_fffffffffffffe58);
  if ((local_45 & 1) == 0) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)in_stack_fffffffffffffe60,
               (mutex_type *)in_stack_fffffffffffffe58);
    bVar1 = std::__cxx11::
            list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
            ::empty((list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
                     *)(in_RDI + 0x288));
    if (bVar1) {
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_stack_fffffffffffffe60);
      auto_fwd_release_rpc_cli::anon_class_32_4_602b9eac::operator()(in_stack_fffffffffffffeb0);
    }
    else {
      local_b0 = (_List_node_base *)
                 std::__cxx11::
                 list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
                 ::begin((list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
                          *)in_stack_fffffffffffffe58);
      std::_List_iterator<nuraft::raft_server::auto_fwd_req_resp>::operator*
                ((_List_iterator<nuraft::raft_server::auto_fwd_req_resp> *)0x1fbee8);
      auto_fwd_req_resp::auto_fwd_req_resp(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      std::__cxx11::
      list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
      ::pop_front((list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
                   *)in_stack_fffffffffffffe60);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1fbf34);
        in_stack_fffffffffffffe84 = (**(code **)(*(long *)peVar3 + 0x38))();
        if (5 < in_stack_fffffffffffffe84) {
          in_stack_fffffffffffffe78 =
               (context *)
               std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1fbf64);
          sVar4 = std::__cxx11::
                  list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
                  ::size((list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
                          *)in_stack_fffffffffffffe60);
          msg_if_given_abi_cxx11_
                    ((char *)local_d0,"found waiting request in the queue, remaining elems %zu",
                     sVar4);
          (*(code *)(in_stack_fffffffffffffe78->state_mgr_).
                    super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr[8].
                    _vptr_state_mgr)
                    (in_stack_fffffffffffffe78,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"auto_fwd_release_rpc_cli",0x137,local_d0);
          std::__cxx11::string::~string(local_d0);
        }
      }
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_stack_fffffffffffffe60);
      in_stack_fffffffffffffe60 = (auto_fwd_req_resp *)&std::placeholders::_2;
      std::
      bind<void(nuraft::raft_server::*)(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&),nuraft::raft_server*,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>&,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>&,std::shared_ptr<nuraft::rpc_client>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                (in_RSI,(raft_server **)
                        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                  *)in_stack_fffffffffffffe78,
                 (shared_ptr<nuraft::raft_server::auto_fwd_pkg> *)in_stack_fffffffffffffe70,
                 (shared_ptr<nuraft::rpc_client> *)in_stack_fffffffffffffe68,__args_4,__args_5);
      std::
      function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>::
      function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,void>
                ((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                  *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      std::
      _Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
      ::~_Bind((_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                *)0x1fc0a0);
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_stack_fffffffffffffe60);
      peVar5 = std::
               __shared_ptr_access<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1fc0b9);
      peVar2 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1fc0cb);
      (*peVar5->_vptr_rpc_client[2])
                (peVar5,local_a8,local_f0,(long)peVar2->auto_forwarding_req_timeout_);
      std::
      function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
      ::~function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                   *)0x1fc0fc);
      auto_fwd_req_resp::~auto_fwd_req_resp(in_stack_fffffffffffffe60);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffe60)
    ;
  }
  else {
    auto_fwd_release_rpc_cli::anon_class_32_4_602b9eac::operator()(in_stack_fffffffffffffeb0);
    std::
    __shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1fbe49);
    EventAwaiter::invoke(in_stack_fffffffffffffe70);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffe60);
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x1fc1cc);
  return;
}

Assistant:

void raft_server::auto_fwd_release_rpc_cli( ptr<auto_fwd_pkg> cur_pkg,
                                            ptr<rpc_client> rpc_cli )
{
    ptr<raft_params> params = ctx_->get_params();
    size_t max_conns =
        std::max(1, params->auto_forwarding_max_connections_);
    bool is_blocking_mode = (params->return_method_ == raft_params::blocking);

    auto put_back_to_idle_list = [&cur_pkg, &rpc_cli, max_conns, this]() {
        cur_pkg->rpc_client_in_use_.erase(rpc_cli);
        cur_pkg->rpc_client_idle_.push_front(rpc_cli);
        p_tr( "release connection %p, idle %zu, in-use %zu, max %zu",
              rpc_cli.get(),
              cur_pkg->rpc_client_idle_.size(),
              cur_pkg->rpc_client_in_use_.size(),
              max_conns );
    };

    std::unique_lock<std::mutex> l(cur_pkg->lock_);
    if (is_blocking_mode) {
        // Blocking mode, put the connection back to idle list,
        // and wake up the sleeping thread.
        put_back_to_idle_list();
        cur_pkg->ea_.invoke();

    } else {
        // Async mode, send the request in the queue.
        std::unique_lock<std::mutex> ll(auto_fwd_reqs_lock_);
        if (!auto_fwd_reqs_.empty()) {
            auto_fwd_req_resp entry = *auto_fwd_reqs_.begin();
            auto_fwd_reqs_.pop_front();
            p_tr( "found waiting request in the queue, remaining elems %zu",
                  auto_fwd_reqs_.size() );
            ll.unlock();

            rpc_handler handler = std::bind( &raft_server::auto_fwd_resp_handler,
                                             this,
                                             entry.resp,
                                             cur_pkg,
                                             rpc_cli,
                                             std::placeholders::_1,
                                             std::placeholders::_2 );

            // Should be unlocked before calling `send`, as resp handler can be
            // invoked in the same thread in case of error.
            l.unlock();
            rpc_cli->send(entry.req, handler, params->auto_forwarding_req_timeout_);

        } else {
            // If no request is waiting, put the connection back to idle list.
            ll.unlock();
            put_back_to_idle_list();
        }
    }
}